

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O3

void do_predict(FILE *input,FILE *output)

{
  char cVar1;
  model *pmVar2;
  feature_node *pfVar3;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  void *__ptr;
  void *__ptr_00;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  ushort **ppuVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar15;
  double dVar16;
  char *endptr;
  char *local_b8;
  ulong local_b0;
  double local_a8;
  undefined8 uStack_a0;
  FILE *local_98;
  int local_90;
  int local_8c;
  undefined1 local_88 [16];
  FILE *local_78;
  void *local_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_98 = (FILE *)input;
  uVar4 = get_nr_class(model_);
  local_8c = get_nr_feature(model_);
  local_90 = (local_8c + 1) - (uint)(model_->bias < 0.0);
  uVar11 = 0;
  if (flag_predict_probability == 0) {
    __ptr_00 = (void *)0x0;
  }
  else {
    iVar5 = check_probability_model();
    if (iVar5 == 0) {
LAB_00102ab2:
      do_predict_cold_1();
      puts(
          "Usage: predict [options] test_file model_file output_file\noptions:\n-b probability_estimates: whether to output probability estimates, 0 or 1 (default 0); currently for logistic regression only\n-q : quiet mode (no outputs)"
          );
      exit(1);
    }
    __ptr = malloc((long)(int)uVar4 * 4);
    get_labels(model_,__ptr);
    __ptr_00 = malloc((long)(int)uVar4 * 8);
    fwrite("labels",6,1,(FILE *)output);
    if (0 < (int)uVar4) {
      uVar12 = 0;
      do {
        fprintf((FILE *)output," %d",(ulong)*(uint *)((long)__ptr + uVar12 * 4));
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    fputc(10,(FILE *)output);
    free(__ptr);
  }
  max_line_len = 0x400;
  line = (char *)malloc(0x400);
  pcVar6 = fgets(line,0x400,local_98);
  if (pcVar6 == (char *)0x0) {
    local_58 = ZEXT816(0);
    local_b0 = 0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    local_88 = ZEXT816(0);
  }
  else {
    local_58 = ZEXT816(0);
    local_b0 = 0;
    uVar11 = 0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    local_88 = ZEXT816(0);
    local_78 = (FILE *)output;
    local_70 = __ptr_00;
LAB_001025df:
    do {
      pcVar6 = line;
      pcVar7 = strrchr(line,10);
      if (pcVar7 == (char *)0x0) {
        lVar14 = (long)max_line_len;
        iVar5 = (int)(lVar14 * 2);
        max_line_len = iVar5;
        pcVar6 = (char *)realloc(pcVar6,lVar14 * 2);
        line = pcVar6;
        sVar8 = strlen(pcVar6);
        pcVar7 = fgets(pcVar6 + (int)sVar8,iVar5 - (int)sVar8,local_98);
        pcVar6 = line;
        if (pcVar7 != (char *)0x0) goto LAB_001025df;
      }
      if (pcVar6 == (char *)0x0) break;
      pcVar6 = strtok(pcVar6," \t\n");
      if (pcVar6 == (char *)0x0) {
LAB_00102aab:
        do_predict_cold_5();
        goto LAB_00102ab2;
      }
      dVar16 = strtod(pcVar6,&local_b8);
      if ((local_b8 == pcVar6) || (*local_b8 != '\0')) {
LAB_00102aa1:
        do_predict_cold_4();
        goto LAB_00102aab;
      }
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = dVar16;
      local_48._12_4_ = extraout_XMM0_Dd;
      uVar4 = 0;
      iVar5 = 0;
      while( true ) {
        lVar14 = (long)max_nr_attr;
        if (max_nr_attr + -2 <= (int)uVar4) {
          max_nr_attr = max_nr_attr * 2;
          x = (feature_node *)realloc(x,lVar14 << 5);
        }
        pcVar6 = strtok((char *)0x0,":");
        pcVar7 = strtok((char *)0x0," \t");
        __ptr_00 = local_70;
        __stream = local_78;
        pfVar3 = x;
        pmVar2 = model_;
        if (pcVar7 == (char *)0x0) break;
        piVar9 = __errno_location();
        *piVar9 = 0;
        lVar14 = strtol(pcVar6,&local_b8,10);
        local_a8 = (double)CONCAT44(local_a8._4_4_,uVar4);
        iVar13 = (int)lVar14;
        x[uVar4].index = iVar13;
        if ((((local_b8 == pcVar6) || (*piVar9 != 0)) || (*local_b8 != '\0')) || (iVar13 <= iVar5))
        {
          do_predict_cold_3();
LAB_00102a97:
          do_predict_cold_2();
          goto LAB_00102aa1;
        }
        *piVar9 = 0;
        dVar16 = strtod(pcVar7,&local_b8);
        pfVar3 = x;
        x[uVar4].value = dVar16;
        if (((local_b8 == pcVar7) || (*piVar9 != 0)) ||
           ((cVar1 = *local_b8, (long)cVar1 != 0 &&
            (ppuVar10 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar10 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_00102a97;
        uVar4 = local_a8._0_4_ + (uint)(pfVar3[uVar4].index <= local_8c);
        iVar5 = iVar13;
      }
      dVar16 = model_->bias;
      if (0.0 <= dVar16) {
        x[uVar4].index = local_90;
        pfVar3[uVar4].value = dVar16;
        uVar4 = uVar4 + 1;
      }
      pfVar3[(int)uVar4].index = -1;
      if (flag_predict_probability == 0) {
        local_a8 = (double)predict();
        uStack_a0 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
        fprintf(__stream,"%g\n");
        __ptr_00 = local_70;
      }
      else {
        local_a8 = (double)predict_probability(pmVar2,pfVar3,local_70);
        uStack_a0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
        fprintf(__stream,"%g");
        if (0 < model_->nr_class) {
          lVar14 = 0;
          do {
            fprintf(__stream," %g",(int)*(undefined8 *)((long)__ptr_00 + lVar14 * 8));
            lVar14 = lVar14 + 1;
          } while (lVar14 < model_->nr_class);
        }
        fputc(10,__stream);
      }
      dVar15 = local_48._0_8_;
      local_b0 = (ulong)((int)local_b0 + (uint)(local_a8 == dVar15));
      local_68 = local_68 + local_a8;
      dStack_60 = dStack_60 + dVar15;
      dVar16 = (double)local_88._8_8_ + (local_a8 - dVar15) * (local_a8 - dVar15);
      local_88._8_4_ = SUB84(dVar16,0);
      local_88._0_8_ = (double)local_88._0_8_ + dVar15 * dVar15;
      local_88._12_4_ = (int)((ulong)dVar16 >> 0x20);
      dVar16 = (double)local_58._8_8_ + local_a8 * dVar15;
      local_58._8_4_ = SUB84(dVar16,0);
      local_58._0_8_ = (double)local_58._0_8_ + local_a8 * local_a8;
      local_58._12_4_ = (int)((ulong)dVar16 >> 0x20);
      uVar11 = (ulong)((int)uVar11 + 1);
      pcVar6 = fgets(line,max_line_len,local_98);
    } while (pcVar6 != (char *)0x0);
  }
  iVar5 = check_regression_model(model_);
  if (iVar5 == 0) {
    (*info)("Accuracy = %g%% (%d/%d)\n",
            SUB84(((double)(int)local_b0 / (double)(int)uVar11) * 100.0,0),local_b0,uVar11);
  }
  else {
    local_a8 = (double)(int)uVar11;
    uStack_a0 = 0;
    (*info)("Mean squared error = %g (regression)\n",SUB84((double)local_88._8_8_ / local_a8,0));
    dVar16 = local_a8 * (double)local_58._8_8_ - local_68 * dStack_60;
    (*info)("Squared correlation coefficient = %g (regression)\n",
            SUB84((dVar16 * dVar16) /
                  (((double)local_88._0_8_ * local_a8 - dStack_60 * dStack_60) *
                  (local_a8 * (double)local_58._0_8_ - local_68 * local_68)),0));
  }
  if (flag_predict_probability == 0) {
    return;
  }
  free(__ptr_00);
  return;
}

Assistant:

void do_predict(FILE *input, FILE *output)
{
	int correct = 0;
	int total = 0;
	double error = 0;
	double sump = 0, sumt = 0, sumpp = 0, sumtt = 0, sumpt = 0;

	int nr_class=get_nr_class(model_);
	double *prob_estimates=NULL;
	int j, n;
	int nr_feature=get_nr_feature(model_);
	if(model_->bias>=0)
		n=nr_feature+1;
	else
		n=nr_feature;

	if(flag_predict_probability)
	{
		int *labels;

		if(!check_probability_model(model_))
		{
			fprintf(stderr, "probability output is only supported for logistic regression\n");
			exit(1);
		}

		labels=(int *) malloc(nr_class*sizeof(int));
		get_labels(model_,labels);
		prob_estimates = (double *) malloc(nr_class*sizeof(double));
		fprintf(output,"labels");
		for(j=0;j<nr_class;j++)
			fprintf(output," %d",labels[j]);
		fprintf(output,"\n");
		free(labels);
	}

	max_line_len = 1024;
	line = (char *)malloc(max_line_len*sizeof(char));
	while(readline(input) != NULL)
	{
		int i = 0;
		double target_label, predict_label;
		char *idx, *val, *label, *endptr;
		int inst_max_index = 0; // strtol gives 0 if wrong format

		label = strtok(line," \t\n");
		if(label == NULL) // empty line
			exit_input_error(total+1);

		target_label = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0')
			exit_input_error(total+1);

		while(1)
		{
			if(i>=max_nr_attr-2)	// need one more for index = -1
			{
				max_nr_attr *= 2;
				x = (struct feature_node *) realloc(x,max_nr_attr*sizeof(struct feature_node));
			}

			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;
			errno = 0;
			x[i].index = (int) strtol(idx,&endptr,10);
			if(endptr == idx || errno != 0 || *endptr != '\0' || x[i].index <= inst_max_index)
				exit_input_error(total+1);
			else
				inst_max_index = x[i].index;

			errno = 0;
			x[i].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr)))
				exit_input_error(total+1);

			// feature indices larger than those in training are not used
			if(x[i].index <= nr_feature)
				++i;
		}

		if(model_->bias>=0)
		{
			x[i].index = n;
			x[i].value = model_->bias;
			i++;
		}
		x[i].index = -1;

		if(flag_predict_probability)
		{
			int j;
			predict_label = predict_probability(model_,x,prob_estimates);
			fprintf(output,"%g",predict_label);
			for(j=0;j<model_->nr_class;j++)
				fprintf(output," %g",prob_estimates[j]);
			fprintf(output,"\n");
		}
		else
		{
			predict_label = predict(model_,x);
			fprintf(output,"%g\n",predict_label);
		}

		if(predict_label == target_label)
			++correct;
		error += (predict_label-target_label)*(predict_label-target_label);
		sump += predict_label;
		sumt += target_label;
		sumpp += predict_label*predict_label;
		sumtt += target_label*target_label;
		sumpt += predict_label*target_label;
		++total;
	}
	if(check_regression_model(model_))
	{
		info("Mean squared error = %g (regression)\n",error/total);
		info("Squared correlation coefficient = %g (regression)\n",
			((total*sumpt-sump*sumt)*(total*sumpt-sump*sumt))/
			((total*sumpp-sump*sump)*(total*sumtt-sumt*sumt))
			);
	}
	else
		info("Accuracy = %g%% (%d/%d)\n",(double) correct/total*100,correct,total);
	if(flag_predict_probability)
		free(prob_estimates);
}